

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O3

LispPTR uraid_commands(void)

{
  DLword *pDVar1;
  __pid_t _Var2;
  LispPTR LVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  LispPTR LVar11;
  char *pcVar12;
  ushort *puVar13;
  bool bVar14;
  char *endpointer;
  int status;
  char *local_40;
  undefined1 local_34 [4];
  
  if (URaid_argnum == -1) {
    lVar5 = (long)URaid_currentFX;
    if (URaid_currentFX <= URaid_ArrMAXIndex) {
      URaid_currentFX = URaid_currentFX + 1;
      sf(URaid_FXarray[lVar5]);
      return 1;
    }
    pcVar12 = "There is no more stack.";
    goto LAB_0013937a;
  }
  if ((byte)URaid_comm[0] < 0x4d) {
    switch(URaid_comm[0]) {
    case '<':
      if (URaid_argnum != 3) {
        pcVar12 = "Mem modify: < Xaddre Xval";
        goto LAB_0013937a;
      }
      piVar7 = __errno_location();
      *piVar7 = 0;
      uVar10 = strtol(URaid_arg1,&local_40,0x10);
      if ((*piVar7 != 0) || (*local_40 != '\0')) goto LAB_00139abb;
      *piVar7 = 0;
      uVar6 = strtol(URaid_arg2,&local_40,0x10);
      if ((*piVar7 != 0) || (*local_40 != '\0')) {
        pcVar12 = "Arg(Xval) not Xaddress";
        goto LAB_0013937a;
      }
      if ((uint)uVar10 < 0x10000000) {
        if ((short)(uVar6 >> 0x10) == 0) {
          Lisp_world[(uint)uVar10 & 0xfffffff] = (DLword)uVar6;
          printf("0x%x : 0x%x\n",uVar10 & 0xffffffff,uVar6 & 0xffffffff);
          return 1;
        }
        pcVar12 = "Xval invalid (16 bit range exceeded).";
        goto LAB_0013937a;
      }
      goto LAB_00139e07;
    case '=':
    case '>':
    case 'A':
      break;
    case '?':
      pcVar12 = 
      "---URAID command summary---\n\n-- Stack display commands\nc\t\t\tChecks all user stack contents\nf number\t\tDisplays stack frame for that frame number (decimal)\nk type\t\t\tChanges the type of stack link following. (a|c)\nl [type]\t\tDisplays backtrace for specified type of stack. (k|m|r|g|p|u|<null>)\n<CR>\t\t\tDisplays next frame.\n\n-- Memory display commands\na litatom\t\tDisplays the top-level value of the litatom\nB Xaddress\t\tDisplays the contents of the arrayblock at that address.\nd litatom\t\tDisplays the definition cell of the litatom\nM\t\t\tDisplays TOS,CSP,PVAR,IVAR,PC\nm func1 func2\t\tMoves definition of func1 to func2 (MOVD)\nO Xaddress\t\tDisplays the object with that address\nt Xaddress\t\tDisplays the type of the object with that address\np litatom\t\tDisplays the property list of the litatom\nw\t\t\tDisplays the current function name and PC\nx Xaddress [xnum]\tDisplays in hexadecimal xnum (16-bit) words starting at Xaddress\n@ litatom val\t\tSets the TOPVAL of litatom to (decimal) val \n< Xaddress Xval\t\tSets the (16-bit) word at the address to Xval\n\n-- Continue or exit commands\ne\t\t\tExits to UNIX\nh\t\t\tPerforms a HARDRESET\nq\t\t\tReturns from URAID with NO change\n\n-- Miscellaneous commands\ns\t\t\tInvokes Shell\nv filename\t\tSaves the virtual memory on the filename (Not Bootable)\n( [num]\t\t\tSets the print level\n!\t\t\tDisplays the error message passed from the emulator\n?\t\t\tDisplays this summary"
      ;
      goto LAB_0013937a;
    case '@':
      if (URaid_argnum != 3) {
        pcVar12 = "SETTOPVAL: @ litatom Decimal-val";
        goto LAB_0013937a;
      }
      LVar3 = parse_atomstring(URaid_arg1);
      if (LVar3 != 0xffffffff) {
        if ((SUB42(URaid_arg2._0_4_,2) & 0xff) == 0x4c && (short)URaid_arg2._0_4_ == 0x494e) {
          LVar11 = 0;
        }
        else {
          LVar11 = 0x4c;
          if (URaid_arg2[0] != 'T') {
            piVar7 = __errno_location();
            *piVar7 = 0;
            lVar5 = strtol(URaid_arg2,&local_40,10);
            if ((*piVar7 != 0) || (*local_40 != '\0')) {
              pcVar12 = " Bad value";
              goto LAB_0013937a;
            }
            uVar4 = (uint)lVar5;
            if (uVar4 - 0x10000 < 0xfffe0000) {
              pcVar12 = "Bad Val range";
              goto LAB_0013937a;
            }
            if ((int)uVar4 < 0) {
              LVar11 = uVar4 & 0xffff | 0xf0000;
            }
            else {
              LVar11 = uVar4 | 0xe0000;
            }
          }
        }
        printf("Old value is ");
        print(*(LispPTR *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 2));
        putchar(10);
        *(LispPTR *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 2) = LVar11;
        goto LAB_00139c8d;
      }
      goto LAB_00139b0a;
    case 'B':
      if (URaid_argnum == 1) {
        pcVar12 = "PRINT-ARRAY-BLOCK: B HEX-LispAddress";
        goto LAB_0013937a;
      }
      piVar7 = __errno_location();
      *piVar7 = 0;
      uVar10 = strtoul(URaid_arg1,&local_40,0x10);
      if ((*piVar7 == 0) && (*local_40 == '\0')) {
        printarrayblock((LispPTR)uVar10);
        return 1;
      }
      goto LAB_00139a24;
    case 'C':
      all_stack_dump(0,0,1);
      return 1;
    default:
      if (URaid_comm[0] == '!') {
        printf("Error message is: %s\n",URaid_errmess);
        return 1;
      }
      if (URaid_comm[0] == '(') {
        uVar10 = 2;
        if (URaid_argnum != 1) {
          piVar7 = __errno_location();
          *piVar7 = 0;
          uVar10 = strtoul(URaid_arg1,&local_40,10);
          if ((*piVar7 != 0) || (*local_40 != '\0')) {
            pcVar12 = "Illegal argument, not number";
            goto LAB_0013937a;
          }
          uVar10 = uVar10 & 0xffffffff;
        }
        PrintMaxLevel = (int)uVar10;
        pcVar12 = "PrintLevel is set to %d.";
LAB_00139486:
        printf(pcVar12,uVar10);
        return 1;
      }
    }
switchD_001392a2_caseD_4e:
    pcVar12 = "Unsupported command.";
    goto LAB_0013937a;
  }
  switch(URaid_comm[0]) {
  case 'M':
    printf("TOS   : 0x%x\n",(ulong)MachineState.tosvalue);
    pDVar1 = MachineState.csp;
    if (((ulong)MachineState.csp & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
    }
    printf("CSTKP : 0x%x\n",(ulong)((long)pDVar1 - (long)Lisp_world) >> 1 & 0xffffffff);
    pDVar1 = MachineState.pvar;
    if (((ulong)MachineState.pvar & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.pvar);
    }
    printf("PVAR  : 0x%x\n",(ulong)((long)pDVar1 - (long)Lisp_world) >> 1 & 0xffffffff);
    pDVar1 = MachineState.ivar;
    if (((ulong)MachineState.ivar & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.ivar);
    }
    printf("IVAR  : 0x%x\n",(ulong)((long)pDVar1 - (long)Lisp_world) >> 1 & 0xffffffff);
    printPC();
LAB_00139358:
    putchar(10);
    return 1;
  default:
    goto switchD_001392a2_caseD_4e;
  case 'O':
    if (URaid_argnum == 1) {
      pcVar12 = "PRINT-INSTANCE: O HEX-LispAddress";
      break;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar10 = strtoul(URaid_arg1,&local_40,0x10);
    if ((*piVar7 == 0) && (*local_40 == '\0')) {
      LVar11 = (LispPTR)uVar10;
LAB_00139c8d:
      print(LVar11);
      return 1;
    }
    goto LAB_00139a24;
  case 'a':
    if (URaid_argnum != 2) {
      pcVar12 = "GETTOPVAL: a litatom";
      break;
    }
    LVar3 = parse_atomstring(URaid_arg1);
    if (LVar3 != 0xffffffff) {
      printf("Atom: %s index %d\n",URaid_arg1,(ulong)LVar3);
      LVar11 = *(LispPTR *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 2);
      goto LAB_00139c8d;
    }
    goto LAB_00139b16;
  case 'c':
    stack_check((StackWord *)0x0);
    return 1;
  case 'd':
    if (URaid_argnum != 2) {
      pcVar12 = "GETD: d litatom";
      break;
    }
    LVar3 = parse_atomstring(URaid_arg1);
    if (LVar3 != 0xffffffff) {
      printf("Atom: %s index %d\n",URaid_arg1,(ulong)LVar3);
      LVar11 = *(uint *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 4) & 0xfffffff;
      uVar10 = (ulong)LVar11;
      if (-1 < (int)*(uint *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 4)) goto LAB_00139c8d;
      pcVar12 = "{CCODEP}0x%x\n";
      goto LAB_00139486;
    }
LAB_00139b16:
    pcVar12 = "No such atom.";
    break;
  case 'e':
    printf("Exit to UNIX?[confirm](Y or N)<");
    uVar4 = getchar();
    if ((uVar4 & 0xffffffdf) == 0x59) {
      exit(0);
    }
    goto LAB_0013980e;
  case 'f':
    if (URaid_argnum == 1) {
      pcVar12 = "DUMP-STACK: f decimal-FXnumber";
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0;
      uVar10 = strtoul(URaid_arg1,&local_40,10);
      if ((*piVar7 == 0) && (*local_40 == '\0')) {
        uVar4 = (uint)uVar10;
        if ((-1 < (int)uVar4) && ((int)uVar4 <= URaid_ArrMAXIndex)) {
          sf(URaid_FXarray[uVar4 & 0x7fffffff]);
          URaid_currentFX = uVar4 + 1;
          return 1;
        }
        pcVar12 = "Frame number doesn\'t exist.";
      }
      else {
        pcVar12 = "Illegal argument, not decimal number";
      }
    }
    break;
  case 'h':
    printf("HARDRESET?[confirm](Y or N)<");
    uVar4 = getchar();
    if ((uVar4 & 0xffffffdf) != 0x59) {
      fflush(_stdin);
      return 1;
    }
    contextsw(1,2,0);
    fflush(_stdin);
    return 0;
  case 'k':
    if ((URaid_arg1[0] & 0xdfU) == 0x43) {
      URaid_scanlink = 1;
      return 1;
    }
    if ((URaid_arg1[0] & 0xdfU) == 0x41) {
      URaid_scanlink = 0;
      return 1;
    }
    pcVar12 = "Link type should be A or C";
    break;
  case 'l':
    if (URaid_argnum == 1) {
switchD_001399cc_caseD_75:
      bt();
      return 1;
    }
    switch(URaid_arg1[0]) {
    case 'g':
      puts("IFP->GCFXP :");
      uVar10 = (ulong)InterfacePage->gcfxp;
      break;
    default:
      pcVar12 = "2nd argument should be k,m,r,g,p,u or null.";
      goto LAB_0013937a;
    case 'k':
      puts("IFP->KBDFXP :");
      uVar10 = (ulong)InterfacePage->kbdfxp;
      break;
    case 'm':
      puts("IFP->MISCFXP :");
      uVar10 = (ulong)InterfacePage->miscfxp;
      break;
    case 'p':
      puts("IFP->FAULTFXP :");
      uVar10 = (ulong)InterfacePage->faultfxp;
      break;
    case 'r':
      puts("IFP->RESETFXP :");
      uVar10 = (ulong)InterfacePage->resetfxp;
      break;
    case 'u':
      goto switchD_001399cc_caseD_75;
    }
    if ((uVar10 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",uVar10);
    }
    bt1((FX *)((ulong)(uint)((int)uVar10 * 2) + (long)Stackspace));
    return 1;
  case 'm':
    if (URaid_argnum == 3) {
      LVar3 = parse_atomstring(URaid_arg1);
      if (LVar3 == 0xffffffff) {
        pcVar12 = "No such function (from)";
      }
      else {
        LVar11 = parse_atomstring(URaid_arg2);
        if (LVar11 != 0xffffffff) {
          *(uint *)(AtomSpace + (ulong)(LVar11 * 5) * 2 + 4) =
               *(uint *)(AtomSpace + (ulong)(LVar11 * 5) * 2 + 4) & 0xf0000000 |
               *(uint *)(AtomSpace + (ulong)(LVar3 * 5) * 2 + 4) & 0xfffffff;
          print(LVar11);
          printf(" is smashed with ");
          print(LVar3);
          goto LAB_00139358;
        }
        pcVar12 = "No such function (to)";
      }
    }
    else {
      pcVar12 = "MOVD: m <from funcname> <to funcname>";
    }
    break;
  case 'p':
    if (URaid_argnum != 2) {
      pcVar12 = "GETPROPLIST : p litatom";
      break;
    }
    LVar3 = parse_atomstring(URaid_arg1);
    if (LVar3 != 0xffffffff) {
      LVar11 = *(uint *)(Plistspace + (ulong)LVar3 * 2) & 0xfffffff;
      goto LAB_00139c8d;
    }
LAB_00139b0a:
    pcVar12 = "No such atom";
    break;
  case 'q':
    printf("Return to Lisp?[confirm](Y or N)<");
    uVar4 = getchar();
    if ((uVar4 & 0xffffffdf) == 0x59) {
      return 0;
    }
LAB_0013980e:
    fflush(_stdin);
    URaid_currentFX = 0x7d1;
    return 1;
  case 's':
    _Var2 = vfork();
    if (_Var2 == 0) {
      execl("/bin/sh","sh","-i",0);
      exit(1);
    }
    if (_Var2 != -1) {
      wait(local_34);
      return 1;
    }
    uraid_commands_cold_1();
  case 't':
    if (URaid_argnum != 2) {
      pcVar12 = "PRINTTYPENAME: t Xaddress";
      break;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar10 = strtoul(URaid_arg1,&local_40,0x10);
    if ((*piVar7 == 0) && (*local_40 == '\0')) {
      if ((uint)uVar10 < 0x10000000) {
        switch(uVar10 >> 0x10 & 0xffff) {
        case 0:
          pcVar12 = "{ATOM}";
          break;
        case 1:
          pcVar12 = "{STK}";
          break;
        case 2:
          pcVar12 = "{PLIST}";
          break;
        default:
          uVar4 = *(ushort *)((ulong)((uint)uVar10 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
          uVar4 = *(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5));
          putchar(0x7b);
          uVar4 = uVar4 & 0xfffffff;
          if (uVar4 == 0) {
            printf("unknown");
          }
          else {
            print_atomname(uVar4);
          }
          pcVar12 = "}";
          goto LAB_0013937a;
        case 4:
          pcVar12 = "{FPTOVP}";
          break;
        case 8:
          pcVar12 = "{PNP}";
          break;
        case 10:
          pcVar12 = "{DEF}";
          break;
        case 0xc:
          pcVar12 = "{VAL}";
          break;
        case 0x12:
        case 0x13:
          pcVar12 = "{DISPLAY}";
        }
        printf(pcVar12);
        pcVar12 = "0x%x\n";
        uVar10 = uVar10 & 0xffffffff;
        goto LAB_00139486;
      }
      goto LAB_00139e07;
    }
LAB_00139a24:
    pcVar12 = "Arg not HEX number";
    break;
  case 'v':
    if (URaid_argnum == 2) {
      LVar3 = vmem_save(URaid_arg1);
      clear_display();
      if (LVar3 == 0) {
        pcVar12 = "VMEMSAVE finished, but it\'s not bootable";
      }
      else {
        pcVar12 = "VMEMSAVE fails";
      }
    }
    else {
      pcVar12 = "VMEMSAVE: v filename (it\'s NOT bootable)";
    }
    break;
  case 'w':
    doko();
    return 1;
  case 'x':
    if (URaid_argnum == 1) {
      pcVar12 = "HEX-DUMP: x Xaddress [Xnum]";
      break;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    uVar10 = strtoul(URaid_arg1,&local_40,0x10);
    if ((*piVar7 != 0) || (*local_40 != '\0')) {
LAB_00139abb:
      pcVar12 = "Arg(Xaddress) not Xaddress";
      break;
    }
    if (URaid_arg2[0] == '\0') {
      uVar4 = 8;
    }
    else {
      *piVar7 = 0;
      lVar5 = strtol(URaid_arg2,&local_40,0x10);
      uVar4 = (uint)lVar5;
      if ((*piVar7 != 0) || (*local_40 != '\0')) {
        pcVar12 = "Arg(Xnum) not Xnum";
        break;
      }
      if ((int)uVar4 < 0) {
        pcVar12 = "Dump words num should be positive";
        break;
      }
    }
    uVar9 = (uint)uVar10;
    if ((uVar9 < 0x10000000) && (uVar9 + uVar4 < 0x10000000)) {
      if (uVar4 == 0) {
        return 1;
      }
      puVar8 = Lisp_world + (uVar9 & 0xfffffff);
      puVar13 = puVar8 + uVar4;
      do {
        if (((ulong)puVar8 & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",puVar8);
        }
        printf("0x%x : ",(ulong)((long)puVar8 - (long)Lisp_world) >> 1 & 0xffffffff);
        if (puVar8 < puVar13) {
          uVar4 = 0;
          do {
            printf("%4x ",(ulong)*puVar8);
            puVar8 = puVar8 + 1;
            if (puVar13 <= puVar8) break;
            bVar14 = uVar4 < 7;
            uVar4 = uVar4 + 1;
          } while (bVar14);
        }
        putchar(10);
        if (puVar13 <= puVar8) {
          return 1;
        }
      } while( true );
    }
LAB_00139e07:
    pcVar12 = "Address out of range.";
  }
LAB_0013937a:
  puts(pcVar12);
  return 1;
}

Assistant:

LispPTR uraid_commands(void) {
  int num, val;
  LispPTR address;
  char *endpointer;
  LispPTR index;
  DefCell *defcell68k;
#ifndef DOS
  int status;
#endif /* DOS */

  if (URaid_argnum == -1) {
    /* disp next FX */
    if (URaid_currentFX > URaid_ArrMAXIndex) {
      printf("There is no more stack.\n");
      return (T);
    } else {
      sf(URaid_FXarray[URaid_currentFX++]);
      return (T);
    }
  }
  switch (URaid_comm[0]) {
/*** Displaying STACK stuff */
#ifdef DOS
    case '1': printf("%s\n", URaid_summary1); break;
    case '2': printf("%s\n", URaid_summary2); break;
    case '3': printf("%s\n", URaid_summary3); break;
#endif /* DOS */
    case 'c': stack_check(0); break;
    case 'C': all_stack_dump(0, 0, T); break;
    case 'f':                /**if((URaid_arg1[0] < '0') || (URaid_arg1[0] > '9')){
                                printf("Illegal argument, not a number\n");
                                 return(T);
                             }**/
      if (URaid_argnum == 1) /* f comm only */
      {
        printf("DUMP-STACK: f decimal-FXnumber\n");
        return (T);
      }
      errno = 0;
      num = (int)strtoul(URaid_arg1, &endpointer, 10);
      if (errno != 0 || *endpointer != '\0') { /* com read fails */
        printf("Illegal argument, not decimal number\n");
        return (T);
      }
      if ((num > URaid_ArrMAXIndex) || (num < 0)) {
        printf("Frame number doesn't exist.\n");
        return (T);
      }
      sf(URaid_FXarray[num]);
      URaid_currentFX = num + 1;
      break;
    case 'k':
      if ((URaid_arg1[0] == 'A') || (URaid_arg1[0] == 'a'))
        URaid_scanlink = URSCAN_ALINK;
      else if ((URaid_arg1[0] == 'C') || (URaid_arg1[0] == 'c'))
        URaid_scanlink = URSCAN_CLINK;
      else
        printf("Link type should be A or C\n");
      break;
    case 'l':
      if (URaid_argnum == 1) {
        bt(); /* default case CURRENTFX */
        return (T);
      }
      switch (URaid_arg1[0]) {
        case 'k':
          printf("IFP->KBDFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->kbdfxp));
          break;
        case 'm':
          printf("IFP->MISCFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->miscfxp));
          break;
        case 'r':
          printf("IFP->RESETFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->resetfxp));
          break;
        case 'g':
          printf("IFP->GCFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->gcfxp));

          break;
        case 'p':
          printf("IFP->FAULTFXP :\n");
          bt1((FX *)NativeAligned4FromStackOffset(InterfacePage->faultfxp));

          break;
        case 'u': bt(); break;
        default: printf("2nd argument should be k,m,r,g,p,u or null.\n"); break;
      } /* switch end */
      break;

    /* Displaying the memory contents stuff */
    case 'a': /* GETTOPVAL */
      if (URaid_argnum != 2) {
        printf("GETTOPVAL: a litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom.\n");
        return (T);
      } else {
	printf("Atom: %s index %d\n", URaid_arg1, index);
      }
      print(*((LispPTR *)GetVALCELL68k(index)));
      break;
    case 'B': { /* print array block */
      LispPTR objaddr;
      if (URaid_argnum == 1) {
        printf("PRINT-ARRAY-BLOCK: B HEX-LispAddress\n");
        return (T);
      }
      errno = 0;
      objaddr = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      printarrayblock(objaddr);
    }
    break;

    case 'd': /* DEFCELL */
      if (URaid_argnum != 2) {
        printf("GETD: d litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom.\n");
        return (T);
      } else {
	printf("Atom: %s index %d\n", URaid_arg1, index);
      }
      defcell68k = (DefCell *)GetDEFCELL68k(index);
      if (defcell68k->ccodep) {
        printf("{CCODEP}0x%x\n", defcell68k->defpointer);
        return (T);
      } else {
        print(defcell68k->defpointer);
        return (T);
      }

    case 'M': /* Machine States */
      printf("TOS   : 0x%x\n", TopOfStack);
      printf("CSTKP : 0x%x\n", LAddrFromNative(CurrentStackPTR));
      printf("PVAR  : 0x%x\n", LAddrFromNative(PVar));
      printf("IVAR  : 0x%x\n", LAddrFromNative(IVar));
      printPC();
      putchar('\n');
      break;
    case 'm': /* MOVD */
      if (URaid_argnum != 3) {
        printf("MOVD: m <from funcname> <to funcname>\n");
        return (T);
      }
      {
        DefCell *fromfunc, *tofunc;
        LispPTR fromindex, toindex;
        if ((fromindex = parse_atomstring(URaid_arg1)) == 0xffffffff) {
          printf("No such function (from)\n");
          return (T);
        }
        if ((toindex = parse_atomstring(URaid_arg2)) == 0xffffffff) {
          printf("No such function (to)\n");
          return (T);
        }

        fromfunc = (DefCell *)GetDEFCELL68k(fromindex);
        tofunc = (DefCell *)GetDEFCELL68k(toindex);
        tofunc->defpointer = fromfunc->defpointer;
        print(toindex);
        printf(" is smashed with ");
        print(fromindex);
        putchar('\n');
      }

      break;
    case 'O': { /* print instance from Laddr. Not documented */
      LispPTR objaddr;
      if (URaid_argnum == 1) {
        printf("PRINT-INSTANCE: O HEX-LispAddress\n");
        return (T);
      }
      errno = 0;
      objaddr = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      print(objaddr);
    } break;
    case 't': /* Object TYPE */
      if (URaid_argnum != 2) {
        printf("PRINTTYPENAME: t Xaddress\n");
        return (T);
      }

      /**HEXNUMP(URaid_arg1,"Not Address");**/
      errno = 0;
      address = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg not HEX number\n");
        return (T);
      }
      ADD_RANGEP(address);

      switch (address >> 16) {
        case ATOM_HI:
          printf("{ATOM}");
          printf("0x%x\n", address);
          break;
        case STK_HI:
          printf("{STK}");
          printf("0x%x\n", address);
          break;
        case PLIS_HI:
          printf("{PLIST}");
          printf("0x%x\n", address);
          break;
        case FPTOVP_HI:
          printf("{FPTOVP}");
          printf("0x%x\n", address);
          break;
        case PNP_HI:
          printf("{PNP}");
          printf("0x%x\n", address);
          break;
        case DEFS_HI:
          printf("{DEF}");
          printf("0x%x\n", address);
          break;
        case VALS_HI:
          printf("{VAL}");
          printf("0x%x\n", address);
          break;
        case DISPLAY_HI:
        case DISPLAY_HI + 1:
          printf("{DISPLAY}");
          printf("0x%x\n", address);
          break;
      default: {
          struct dtd *dtd = (struct dtd*)GetDTD(GetTypeNumber(address));
#ifdef BIGVM
          index = dtd->dtd_name;
#else
          index = (dtd->dtd_namehi << 16) + dtd->dtd_namelo;
#endif
          putchar('{');
          if (index != 0) {
              print_atomname(index);
          } else {
              printf("unknown");
          }
          printf("}\n");
          break;
      }
      } /* switch end */

      break;
#define GetPROPCELL68k(index) ((LispPTR *)Plistspace + (index))

    case 'p': /* property list */
      if (URaid_argnum != 2) {
        printf("GETPROPLIST : p litatom\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom\n");
        return (T);
      }
      print(*(GetPROPCELL68k(index)) & POINTERMASK);
      break;

    case 'w': /* Disp CurrentFunc name & PC */ doko(); break;

#define XDUMPW 8
    case 'x': /* HEX dump "x Xaddress Xnum" */
      /* Obsolete
      HEXNUMP(URaid_arg1,"Not Address");
      HEXNUMP(URaid_arg2,"Not number");
      ***/
      if (URaid_argnum == 1) { /* for help */
        printf("HEX-DUMP: x Xaddress [Xnum]\n");
        return (T);
      }
      errno = 0;
      address = (LispPTR)strtoul(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xaddress) not Xaddress\n");
        return (T);
      }
      if (URaid_arg2[0] == '\0') {
        num = XDUMPW;
      } else {
        errno = 0;
        num = strtol(URaid_arg2, &endpointer, 16);
        if (errno != 0 || *endpointer != '\0') {
          printf("Arg(Xnum) not Xnum\n");
          return (T);
        }
      }
      if (num < 0) {
        printf("Dump words num should be positive\n");
        return (T);
      }
      /* Address range check */
      ADD_RANGEP(address);
      ADD_RANGEP(address + num);

      {
        int i;
        DLword *ptr, *endptr;
        ptr = (DLword *)NativeAligned2FromLAddr(address);
        endptr = ptr + num;

        while (ptr < endptr) {
          printf("0x%x : ", LAddrFromNative(ptr));

          for (i = 0; ((ptr < endptr) && (i < XDUMPW)); ptr++, i++) { printf("%4x ", *ptr); }
          putchar('\n');
        }
      }
      break;
    case '@': /* SETTOPVAL */
      if (URaid_argnum != 3) {
        printf("SETTOPVAL: @ litatom Decimal-val\n");
        return (T);
      }
      if ((index = parse_atomstring(URaid_arg1)) == 0xffffffff) {
        printf("No such atom\n");
        return (T);
      }
      if (strncmp(URaid_arg2, "NIL", 3) == 0) {
        val = NIL;
      } else if (*URaid_arg2 == 'T')
        val = ATOM_T;
      else {
        errno = 0;
        val = strtol(URaid_arg2, &endpointer, 10);
        if (errno != 0 || *endpointer != '\0') {
          printf(" Bad value\n");
          return (T);
        } else {
          if ((val < -65536) || (65535 < val)) {
            printf("Bad Val range\n");
            return (T);
          }
          if (val >= 0)
            val |= S_POSITIVE;
          else {
            val = val & 0xffff;
            val |= S_NEGATIVE;
          }
        }
      }
      printf("Old value is ");
      print(*((LispPTR *)GetVALCELL68k(index)));
      putchar('\n');
      *((LispPTR *)GetVALCELL68k(index)) = (LispPTR)val;
      print(val);
      break;

    case '<':
      if (URaid_argnum != 3) {
        printf("Mem modify: < Xaddre Xval\n");
        return (T);
      }
      /* Assignment */
      /* OBSOLETE
      HEXNUMP(URaid_arg1,"Not Address");
      HEXNUMP(URaid_arg2,"Not Proper Value");
      ***/

      errno = 0;
      address = (LispPTR)strtol(URaid_arg1, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xaddress) not Xaddress\n");
        return (T);
      }
      errno = 0;
      val = strtol(URaid_arg2, &endpointer, 16);
      if (errno != 0 || *endpointer != '\0') {
        printf("Arg(Xval) not Xaddress\n");
        return (T);
      }

      ADD_RANGEP(address);
      if (val < 0 || val > 0xffff) {
        printf("Xval invalid (16 bit range exceeded).\n");
        return (T);
      }

      {
        DLword *ptr;
        ptr = (DLword *)NativeAligned2FromLAddr(address);
        *ptr = val;
        printf("0x%x : 0x%x\n", address, *ptr);
      }
      break;

    /****MISC ****/
    case 'q': /* return with do Nothing */
      printf("Return to Lisp?[confirm](Y or N)<");
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) {
          /*TopOfStack = NIL;*/
          return (NIL);
        }
      }
      fflush(stdin);
      URaid_currentFX = URMAXFXNUM + 1;
      return (T);
    /* break; */
    case 'h': /* HARDRESET */
      printf("HARDRESET?[confirm](Y or N)<");
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) {
          /*PC+= 3; for currentfx->pc ajust:MOve to subr */
          contextsw(ResetFXP, 2, 0);
          /*PC -= 3;  in subr.c it increments by 3 */
          fflush(stdin);
          return (NIL); /* return to dispatch */
        }
      }
      fflush(stdin);
      break;
    case 'e': /* exit to UNIX */
#ifdef DOS
      printf("Exit to DOS?[confirm](Y or N)<");
#else  /* DOS */
      printf("Exit to UNIX?[confirm](Y or N)<");
#endif /* DOS */
      {
        int c;
        c = getchar();
        if ((c == 'Y') || (c == 'y')) exit(0);
      }
      fflush(stdin);
      URaid_currentFX = URMAXFXNUM + 1;
      break;
    case 's': /* SHELL */
      switch (vfork()) {
        case -1: (void)(void)fprintf(stderr, "uraid: Fork failed.\n"); exit(1);

        case 0: (void)execl("/bin/sh", "sh", "-i", NULL); exit(1);

        default: break;
      }
#ifndef DOS
      (void)wait(&status);
/* system("/bin/sh -i"); */
#endif /* DOS */
      return (T);
    /* break; */
    case 'v':
      if (URaid_argnum != 2) {
        printf("VMEMSAVE: v filename (it's NOT bootable)\n");
        return (T);
      }
      if (vmem_save(URaid_arg1) != NIL) {
#ifndef DISPLAYBUFFER
        clear_display();
#endif /* DISPLAYBUFFER */

        printf("VMEMSAVE fails\n");
      } else {
        clear_display();
        printf("VMEMSAVE finished, but it's not bootable\n");
      }
      break;
    case '(':
      if (URaid_argnum == 1)
        num = 2;
      else {
        errno = 0;
        num = strtoul(URaid_arg1, &endpointer, 10);
        if (errno != 0 || *endpointer != '\0') { 
          printf("Illegal argument, not number\n");
          return (T);
        }
      }
      PrintMaxLevel = num;
      printf("PrintLevel is set to %d.", num);
      break;
    case '?':
#ifdef DOS
      printf(
          " 1: <<Displaying the Stack>>\n 2: <<Displaying memory contents>>\n 3: <<Return or "
          "Exit>>\n");
#else
      printf("%s\n", URaid_summary);
#endif /* DOS */
      break;
    case '!': printf("Error message is: %s\n", URaid_errmess); break;

    default: printf("Unsupported command.\n"); break;

  } /* switch end */
  return (T);
}